

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

MethodOptions * __thiscall
google::protobuf::MethodOptions::operator=(MethodOptions *this,MethodOptions *from)

{
  bool bVar1;
  Arena *lhs;
  Arena *rhs;
  MethodOptions *from_local;
  MethodOptions *this_local;
  
  if (this != from) {
    lhs = MessageLite::GetArena((MessageLite *)this);
    rhs = MessageLite::GetArena((MessageLite *)from);
    bVar1 = internal::CanMoveWithInternalSwap(lhs,rhs);
    if (bVar1) {
      InternalSwap(this,from);
    }
    else {
      CopyFrom(this,from);
    }
  }
  return this;
}

Assistant:

inline MethodOptions& operator=(MethodOptions&& from) noexcept {
    if (this == &from) return *this;
    if (::google::protobuf::internal::CanMoveWithInternalSwap(GetArena(), from.GetArena())) {
      InternalSwap(&from);
    } else {
      CopyFrom(from);
    }
    return *this;
  }